

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O3

Matrix33 *
AML::eulerAngleRatesMatrix_XYZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_58;
  double local_50;
  double dStack_48;
  undefined8 local_40;
  double local_38;
  double local_30;
  undefined8 local_28;
  double local_20;
  double dStack_18;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dStack_48 = tan(theta);
  local_58 = 1.0;
  local_50 = dStack_48 * dVar2;
  dStack_48 = dStack_48 * dVar1;
  local_40 = 0;
  local_30 = -dVar2;
  local_28 = 0;
  local_20 = (1.0 / dVar3) * dVar2;
  dStack_18 = (1.0 / dVar3) * dVar1;
  local_38 = dVar1;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngleRatesMatrix_XYZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double tanTheta = tan(theta);
        const double secTheta = 1.0 / cosTheta;

        double data[3][3] = { { 1.0, sinPhi * tanTheta, cosPhi * tanTheta },
                              { 0.0, cosPhi, -sinPhi },
                              { 0.0, sinPhi * secTheta, cosPhi * secTheta } };

        return Matrix33(data);
    }